

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nibbler.cpp
# Opt level: O0

bool __thiscall Nibbler::getDigit4(Nibbler *this,int *result)

{
  int iVar1;
  char *pcVar2;
  intmax_t iVar3;
  string local_48 [32];
  ulong local_28;
  size_type i;
  int *result_local;
  Nibbler *this_local;
  
  local_28 = this->_cursor;
  if ((local_28 < this->_length) && (3 < this->_length - local_28)) {
    i = (size_type)result;
    result_local = (int *)this;
    pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)this);
    iVar1 = isdigit((int)*pcVar2);
    if (iVar1 != 0) {
      pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)this);
      iVar1 = isdigit((int)*pcVar2);
      if (iVar1 != 0) {
        pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)this);
        iVar1 = isdigit((int)*pcVar2);
        if (iVar1 != 0) {
          pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)this);
          iVar1 = isdigit((int)*pcVar2);
          if (iVar1 != 0) {
            std::__cxx11::string::substr((ulong)local_48,(ulong)this);
            pcVar2 = (char *)std::__cxx11::string::c_str();
            iVar3 = strtoimax(pcVar2,(char **)0x0,10);
            *(int *)i = (int)iVar3;
            std::__cxx11::string::~string(local_48);
            this->_cursor = this->_cursor + 4;
            return true;
          }
        }
      }
    }
  }
  return false;
}

Assistant:

bool Nibbler::getDigit4 (int& result)
{
  std::string::size_type i = _cursor;
  if (i < _length &&
      _length - i >= 4)
  {
    if (isdigit (_input[i + 0]) &&
        isdigit (_input[i + 1]) &&
        isdigit (_input[i + 2]) &&
        isdigit (_input[i + 3]))
    {
      result = strtoimax (_input.substr (_cursor, 4).c_str (), NULL, 10);
      _cursor += 4;
      return true;
    }
  }

  return false;
}